

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* jsoncons::
  decode_traits<std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>,char,void>
  ::
  decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
            (basic_staj_cursor<char> *cursor,
            json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
            *decoder,error_code *ec)

{
  bool bVar1;
  staj_event_type sVar2;
  basic_staj_event<char> *pbVar3;
  error_code *in_RCX;
  long *in_RSI;
  error_code *in_RDI;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  v;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  byte bVar4;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffff80;
  error_code *this;
  error_code *in_stack_ffffffffffffffc8;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffffd0;
  basic_staj_cursor<char> *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x49c865);
  (**(code **)(*in_RSI + 0x10))();
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (bVar1) {
    memset(this,0,0x18);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x49c8a9);
  }
  else {
    pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
    sVar2 = basic_staj_event<char>::event_type(pbVar3);
    if (sVar2 == begin_array) {
      (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      while( true ) {
        pbVar3 = (basic_staj_event<char> *)(**(code **)(*in_RSI + 0x20))();
        sVar2 = basic_staj_event<char>::event_type(pbVar3);
        bVar4 = 0;
        if (sVar2 != end_array) {
          bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
          bVar4 = bVar1 ^ 0xff;
        }
        if ((bVar4 & 1) == 0) {
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)pbVar3,
                   (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)CONCAT17(bVar4,in_stack_ffffffffffffff78));
          goto LAB_0049ca31;
        }
        decode_traits<std::vector<double,std::allocator<double>>,char,void>::
        decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)pbVar3,(value_type *)CONCAT17(bVar4,in_stack_ffffffffffffff78));
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)this);
        bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
        if (bVar1) break;
        (**(code **)(*in_RSI + 0x40))(in_RSI,in_RCX);
      }
      memset(this,0,0x18);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)0x49c9dc);
    }
    else {
      std::error_code::operator=(this,(conv_errc)((ulong)pbVar3 >> 0x20));
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector(in_stack_ffffffffffffff80,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    }
  }
LAB_0049ca31:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)this);
  return (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)in_RDI;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            T v;

            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            if (cursor.current().event_type() != staj_event_type::begin_array)
            {
                ec = conv_errc::not_vector;
                return v;
            }
            cursor.next(ec);
            while (cursor.current().event_type() != staj_event_type::end_array && !ec)
            {
                v.push_back(decode_traits<value_type,CharT>::decode(cursor, decoder, ec));
                if (JSONCONS_UNLIKELY(ec)) {return T{};}
                //std::cout << "read next 10\n";
                cursor.next(ec);
            }
            return v;
        }